

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

int __thiscall CTcSymEnumBase::write_to_sym_file(CTcSymEnumBase *this,CVmFile *fp)

{
  int iVar1;
  CTcSymbolBase *in_RDI;
  char buf [32];
  int result;
  CVmFile *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc9;
  CVmFile *in_stack_ffffffffffffffd0;
  
  iVar1 = CTcSymbolBase::write_to_sym_file(in_RDI,in_stack_ffffffffffffffb8);
  if (iVar1 != 0) {
    CVmFile::write_bytes
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT71(in_stack_ffffffffffffffc9,
                                ((ulong)in_RDI[1].super_CVmHashEntryCS.super_CVmHashEntry.nxt_ & 1)
                                != 0),(size_t)in_RDI);
  }
  return iVar1;
}

Assistant:

int CTcSymEnumBase::write_to_sym_file(CVmFile *fp)
{
    int result;
    char buf[32];

    /* inherit default */
    result =  CTcSymbol::write_to_sym_file(fp);

    /* write the 'token' flag */
    if (result)
    {
        /* clear the flags */
        buf[0] = 0;

        /* set the 'token' flag if appropriate */
        if (is_token_)
            buf[0] |= 1;

        /* write the flags */
        fp->write_bytes(buf, 1);
    }

    /* return the result */
    return result;
}